

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_close.c
# Opt level: O0

int add_data(zip_t *za,zip_source_t *src,zip_dirent_t *de,zip_uint32_t changed)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  zip_int64_t offset;
  zip_encryption_implementation p_Var4;
  zip_source_t *pzVar5;
  zip_int64_t zVar6;
  zip_int64_t offset_00;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool local_101;
  uint local_100;
  uint local_f4;
  char *local_f0;
  char *password;
  zip_encryption_implementation impl_1;
  zip_encryption_implementation impl;
  zip_uint64_t max_size;
  _Bool needs_encrypt;
  _Bool needs_decrypt;
  uint uStack_c4;
  _Bool needs_reencrypt;
  _Bool needs_compress;
  _Bool needs_crc;
  _Bool needs_decompress;
  _Bool needs_recompress;
  zip_flags_t flags;
  int is_zip64;
  int ret;
  zip_source_t *src_tmp;
  zip_source_t *src_final;
  zip_file_attributes_t attributes;
  zip_stat_t st;
  zip_int64_t data_length;
  zip_int64_t offend;
  zip_int64_t offdata;
  zip_int64_t offstart;
  zip_uint32_t changed_local;
  zip_dirent_t *de_local;
  zip_source_t *src_local;
  zip_t *za_local;
  
  iVar2 = zip_source_stat(src,(zip_stat_t *)&attributes.general_purpose_bit_flags);
  if (iVar2 < 0) {
    _zip_error_set_from_source(&za->error,src);
    za_local._4_4_ = -1;
  }
  else {
    if ((attributes._16_8_ & 0x40) == 0) {
      attributes._16_8_ = attributes._16_8_ | 0x40;
      st.mtime._4_2_ = 0;
    }
    if (((de->comp_method == -1) || (de->comp_method == -2)) && (st.mtime._4_2_ != 0)) {
      de->comp_method = (uint)st.mtime._4_2_;
    }
    else if ((de->comp_method == 0) && ((attributes._16_8_ & 4) != 0)) {
      attributes._16_8_ = attributes._16_8_ | 8;
      st.size = st.index;
    }
    else {
      attributes._16_8_ = attributes._16_8_ & 0xfffffff7;
    }
    if ((attributes._16_8_ & 0x80) == 0) {
      attributes._16_8_ = attributes._16_8_ | 0x80;
      st.mtime._6_2_ = 0;
    }
    uStack_c4 = 0x100;
    if ((attributes._16_8_ & 4) == 0) {
      uStack_c4 = 0x500;
      st.flags = 0xffffffff;
      st._60_4_ = 0xffffffff;
    }
    else {
      de->uncomp_size = st.index;
      st._56_8_ = st.index;
      if ((attributes._16_8_ & 8) == 0) {
        if ((de->comp_method == -1) || (de->comp_method == -2)) {
          local_f4 = 8;
        }
        else {
          local_f4 = de->comp_method;
        }
        if ((short)local_f4 == 0) {
          impl = (zip_encryption_implementation)0xffffffff;
        }
        else if ((local_f4 & 0xffff) == 8) {
          impl = (zip_encryption_implementation)0xffec0183;
        }
        else if ((local_f4 & 0xffff) == 0xc) {
          impl = (zip_encryption_implementation)0xfe792114;
        }
        else {
          impl = (zip_encryption_implementation)0x0;
        }
        if (impl < st.index) {
          uStack_c4 = 0x500;
        }
      }
      else {
        de->comp_size = st.size;
      }
    }
    offset = zip_source_tell_write(za->src);
    if (offset < 0) {
      _zip_error_set_from_source(&za->error,za->src);
      za_local._4_4_ = -1;
    }
    else {
      de->bitflags = de->bitflags & 0xfff7;
      iVar2 = _zip_dirent_write(za,de,uStack_c4);
      if (iVar2 < 0) {
        za_local._4_4_ = -1;
      }
      else {
        if ((de->comp_method == -1) || (de->comp_method == -2)) {
          local_100 = 8;
        }
        else {
          local_100 = de->comp_method;
        }
        bVar7 = (uint)st.mtime._4_2_ != (local_100 & 0xffff);
        local_101 = bVar7 && st.mtime._4_2_ != 0;
        bVar1 = true;
        if (st.mtime._4_2_ != 0) {
          bVar1 = local_101;
        }
        bVar8 = false;
        if (bVar7) {
          bVar8 = de->comp_method != 0;
        }
        bVar9 = true;
        if ((!bVar7) && (bVar9 = true, (de->changed & 0x80) == 0)) {
          bVar9 = de->encryption_method != st.mtime._6_2_;
        }
        bVar7 = false;
        if (bVar9) {
          bVar7 = de->encryption_method != 0;
        }
        zip_source_keep(src);
        src_tmp = src;
        if (bVar9 && st.mtime._6_2_ != 0) {
          p_Var4 = _zip_get_encryption_implementation(st.mtime._6_2_,0);
          if (p_Var4 == (zip_encryption_implementation)0x0) {
            zip_error_set(&za->error,0x18,0);
            zip_source_free(src);
            return -1;
          }
          src_tmp = (*p_Var4)(za,src,st.mtime._6_2_,0,za->default_password);
          if (src_tmp == (zip_source_t *)0x0) {
            zip_source_free(src);
            return -1;
          }
          zip_source_free(src);
        }
        if (local_101) {
          pzVar5 = zip_source_decompress(za,src_tmp,(uint)st.mtime._4_2_);
          if (pzVar5 == (zip_source_t *)0x0) {
            zip_source_free(src_tmp);
            return -1;
          }
          zip_source_free(src_tmp);
          src_tmp = pzVar5;
        }
        if (bVar1) {
          pzVar5 = zip_source_crc(za,src_tmp,0);
          if (pzVar5 == (zip_source_t *)0x0) {
            zip_source_free(src_tmp);
            return -1;
          }
          zip_source_free(src_tmp);
          src_tmp = pzVar5;
        }
        if (bVar8) {
          pzVar5 = zip_source_compress(za,src_tmp,de->comp_method,(uint)de->compression_level);
          if (pzVar5 == (zip_source_t *)0x0) {
            zip_source_free(src_tmp);
            return -1;
          }
          zip_source_free(src_tmp);
          src_tmp = pzVar5;
        }
        if (bVar7) {
          local_f0 = (char *)0x0;
          if (de->password == (char *)0x0) {
            if (za->default_password != (char *)0x0) {
              local_f0 = za->default_password;
            }
          }
          else {
            local_f0 = de->password;
          }
          p_Var4 = _zip_get_encryption_implementation(de->encryption_method,1);
          if (p_Var4 == (zip_encryption_implementation)0x0) {
            zip_error_set(&za->error,0x18,0);
            zip_source_free(src_tmp);
            return -1;
          }
          pzVar5 = (*p_Var4)(za,src_tmp,de->encryption_method,1,local_f0);
          if (pzVar5 == (zip_source_t *)0x0) {
            zip_source_free(src_tmp);
            return -1;
          }
          if (de->encryption_method == 1) {
            de->bitflags = de->bitflags | 8;
          }
          zip_source_free(src_tmp);
          src_tmp = pzVar5;
        }
        zVar6 = zip_source_tell_write(za->src);
        if (zVar6 < 0) {
          _zip_error_set_from_source(&za->error,za->src);
          za_local._4_4_ = -1;
        }
        else {
          flags = copy_source(za,src_tmp,st._56_8_);
          iVar3 = zip_source_stat(src_tmp,(zip_stat_t *)&attributes.general_purpose_bit_flags);
          if (iVar3 < 0) {
            _zip_error_set_from_source(&za->error,src_tmp);
            flags = 0xffffffff;
          }
          iVar3 = zip_source_get_file_attributes(src_tmp,(zip_file_attributes_t *)&src_final);
          if (iVar3 != 0) {
            _zip_error_set_from_source(&za->error,src_tmp);
            flags = 0xffffffff;
          }
          zip_source_free(src_tmp);
          if ((int)flags < 0) {
            za_local._4_4_ = -1;
          }
          else {
            offset_00 = zip_source_tell_write(za->src);
            if (offset_00 < 0) {
              _zip_error_set_from_source(&za->error,za->src);
              za_local._4_4_ = -1;
            }
            else {
              iVar3 = zip_source_seek_write(za->src,offset,0);
              if (iVar3 < 0) {
                _zip_error_set_from_source(&za->error,za->src);
                za_local._4_4_ = -1;
              }
              else if ((attributes._16_8_ & 100) == 100) {
                if ((de->changed & 0x20) == 0) {
                  if ((attributes._16_8_ & 0x10) == 0) {
                    time(&de->last_mod);
                  }
                  else {
                    de->last_mod = st.comp_size;
                  }
                }
                de->comp_method = (uint)st.mtime._4_2_;
                de->crc = (zip_uint32_t)st.mtime;
                de->uncomp_size = st.index;
                de->comp_size = offset_00 - zVar6;
                _zip_dirent_apply_attributes
                          (de,(zip_file_attributes_t *)&src_final,(uStack_c4 & 0x400) != 0,changed);
                iVar3 = _zip_dirent_write(za,de,uStack_c4);
                if (iVar3 < 0) {
                  za_local._4_4_ = -1;
                }
                else if (iVar2 == iVar3) {
                  iVar3 = zip_source_seek_write(za->src,offset_00,0);
                  if (iVar3 < 0) {
                    _zip_error_set_from_source(&za->error,za->src);
                    za_local._4_4_ = -1;
                  }
                  else if (((de->bitflags & 8) == 0) ||
                          (iVar2 = write_data_descriptor(za,de,iVar2), -1 < iVar2)) {
                    za_local._4_4_ = 0;
                  }
                  else {
                    za_local._4_4_ = -1;
                  }
                }
                else {
                  zip_error_set(&za->error,0x14,0);
                  za_local._4_4_ = -1;
                }
              }
              else {
                zip_error_set(&za->error,0x14,0);
                za_local._4_4_ = -1;
              }
            }
          }
        }
      }
    }
  }
  return za_local._4_4_;
}

Assistant:

static int
add_data(zip_t *za, zip_source_t *src, zip_dirent_t *de, zip_uint32_t changed) {
    zip_int64_t offstart, offdata, offend, data_length;
    zip_stat_t st;
    zip_file_attributes_t attributes;
    zip_source_t *src_final, *src_tmp;
    int ret;
    int is_zip64;
    zip_flags_t flags;
    bool needs_recompress, needs_decompress, needs_crc, needs_compress, needs_reencrypt, needs_decrypt, needs_encrypt;

    if (zip_source_stat(src, &st) < 0) {
	_zip_error_set_from_source(&za->error, src);
	return -1;
    }

    if ((st.valid & ZIP_STAT_COMP_METHOD) == 0) {
	st.valid |= ZIP_STAT_COMP_METHOD;
	st.comp_method = ZIP_CM_STORE;
    }

    if (ZIP_CM_IS_DEFAULT(de->comp_method) && st.comp_method != ZIP_CM_STORE)
	de->comp_method = st.comp_method;
    else if (de->comp_method == ZIP_CM_STORE && (st.valid & ZIP_STAT_SIZE)) {
	st.valid |= ZIP_STAT_COMP_SIZE;
	st.comp_size = st.size;
    }
    else {
	/* we'll recompress */
	st.valid &= ~ZIP_STAT_COMP_SIZE;
    }

    if ((st.valid & ZIP_STAT_ENCRYPTION_METHOD) == 0) {
	st.valid |= ZIP_STAT_ENCRYPTION_METHOD;
	st.encryption_method = ZIP_EM_NONE;
    }

    flags = ZIP_EF_LOCAL;

    if ((st.valid & ZIP_STAT_SIZE) == 0) {
	flags |= ZIP_FL_FORCE_ZIP64;
	data_length = -1;
    }
    else {
	de->uncomp_size = st.size;
	/* this is technically incorrect (copy_source counts compressed data), but it's the best we have */
	data_length = (zip_int64_t)st.size;

	if ((st.valid & ZIP_STAT_COMP_SIZE) == 0) {
	    zip_uint64_t max_size;

	    switch (ZIP_CM_ACTUAL(de->comp_method)) {
	    case ZIP_CM_BZIP2:
		/* computed by looking at increase of 10 random files of size 1MB when
		 * compressed with bzip2, rounded up: 1.006 */
		max_size = 4269351188u;
		break;

	    case ZIP_CM_DEFLATE:
		/* max deflate size increase: size + ceil(size/16k)*5+6 */
		max_size = 4293656963u;
		break;

	    case ZIP_CM_STORE:
		max_size = 0xffffffffu;
		break;

	    default:
		max_size = 0;
	    }

	    if (st.size > max_size) {
		flags |= ZIP_FL_FORCE_ZIP64;
	    }
	}
	else
	    de->comp_size = st.comp_size;
    }

    if ((offstart = zip_source_tell_write(za->src)) < 0) {
	_zip_error_set_from_source(&za->error, za->src);
	return -1;
    }

    /* as long as we don't support non-seekable output, clear data descriptor bit */
    de->bitflags &= (zip_uint16_t)~ZIP_GPBF_DATA_DESCRIPTOR;
    if ((is_zip64 = _zip_dirent_write(za, de, flags)) < 0) {
	return -1;
    }

    needs_recompress = st.comp_method != ZIP_CM_ACTUAL(de->comp_method);
    needs_decompress = needs_recompress && (st.comp_method != ZIP_CM_STORE);
    needs_crc = (st.comp_method == ZIP_CM_STORE) || needs_decompress;
    needs_compress = needs_recompress && (de->comp_method != ZIP_CM_STORE);

    needs_reencrypt = needs_recompress || (de->changed & ZIP_DIRENT_PASSWORD) || (de->encryption_method != st.encryption_method);
    needs_decrypt = needs_reencrypt && (st.encryption_method != ZIP_EM_NONE);
    needs_encrypt = needs_reencrypt && (de->encryption_method != ZIP_EM_NONE);

    src_final = src;
    zip_source_keep(src_final);

    if (needs_decrypt) {
	zip_encryption_implementation impl;

	if ((impl = _zip_get_encryption_implementation(st.encryption_method, ZIP_CODEC_DECODE)) == NULL) {
	    zip_error_set(&za->error, ZIP_ER_ENCRNOTSUPP, 0);
	    zip_source_free(src_final);
	    return -1;
	}
	if ((src_tmp = impl(za, src_final, st.encryption_method, ZIP_CODEC_DECODE, za->default_password)) == NULL) {
	    /* error set by impl */
	    zip_source_free(src_final);
	    return -1;
	}

	zip_source_free(src_final);
	src_final = src_tmp;
    }

    if (needs_decompress) {
	if ((src_tmp = zip_source_decompress(za, src_final, st.comp_method)) == NULL) {
	    zip_source_free(src_final);
	    return -1;
	}

	zip_source_free(src_final);
	src_final = src_tmp;
    }

    if (needs_crc) {
	if ((src_tmp = zip_source_crc(za, src_final, 0)) == NULL) {
	    zip_source_free(src_final);
	    return -1;
	}

	zip_source_free(src_final);
	src_final = src_tmp;
    }

    if (needs_compress) {
	if ((src_tmp = zip_source_compress(za, src_final, de->comp_method, de->compression_level)) == NULL) {
	    zip_source_free(src_final);
	    return -1;
	}

	zip_source_free(src_final);
	src_final = src_tmp;
    }


    if (needs_encrypt) {
	zip_encryption_implementation impl;
	const char *password = NULL;

	if (de->password) {
	    password = de->password;
	}
	else if (za->default_password) {
	    password = za->default_password;
	}

	if ((impl = _zip_get_encryption_implementation(de->encryption_method, ZIP_CODEC_ENCODE)) == NULL) {
	    zip_error_set(&za->error, ZIP_ER_ENCRNOTSUPP, 0);
	    zip_source_free(src_final);
	    return -1;
	}
	if ((src_tmp = impl(za, src_final, de->encryption_method, ZIP_CODEC_ENCODE, password)) == NULL) {
	    /* error set by impl */
	    zip_source_free(src_final);
	    return -1;
	}
	if (de->encryption_method == ZIP_EM_TRAD_PKWARE) {
	    de->bitflags |= ZIP_GPBF_DATA_DESCRIPTOR;
	}

	zip_source_free(src_final);
	src_final = src_tmp;
    }


    if ((offdata = zip_source_tell_write(za->src)) < 0) {
	_zip_error_set_from_source(&za->error, za->src);
	return -1;
    }

    ret = copy_source(za, src_final, data_length);

    if (zip_source_stat(src_final, &st) < 0) {
	_zip_error_set_from_source(&za->error, src_final);
	ret = -1;
    }

    if (zip_source_get_file_attributes(src_final, &attributes) != 0) {
	_zip_error_set_from_source(&za->error, src_final);
	ret = -1;
    }

    zip_source_free(src_final);

    if (ret < 0) {
	return -1;
    }

    if ((offend = zip_source_tell_write(za->src)) < 0) {
	_zip_error_set_from_source(&za->error, za->src);
	return -1;
    }

    if (zip_source_seek_write(za->src, offstart, SEEK_SET) < 0) {
	_zip_error_set_from_source(&za->error, za->src);
	return -1;
    }

    if ((st.valid & (ZIP_STAT_COMP_METHOD | ZIP_STAT_CRC | ZIP_STAT_SIZE)) != (ZIP_STAT_COMP_METHOD | ZIP_STAT_CRC | ZIP_STAT_SIZE)) {
	zip_error_set(&za->error, ZIP_ER_INTERNAL, 0);
	return -1;
    }

    if ((de->changed & ZIP_DIRENT_LAST_MOD) == 0) {
	if (st.valid & ZIP_STAT_MTIME)
	    de->last_mod = st.mtime;
	else
	    time(&de->last_mod);
    }
    de->comp_method = st.comp_method;
    de->crc = st.crc;
    de->uncomp_size = st.size;
    de->comp_size = (zip_uint64_t)(offend - offdata);
    _zip_dirent_apply_attributes(de, &attributes, (flags & ZIP_FL_FORCE_ZIP64) != 0, changed);

    if ((ret = _zip_dirent_write(za, de, flags)) < 0)
	return -1;

    if (is_zip64 != ret) {
	/* Zip64 mismatch between preliminary file header written before data and final file header written afterwards */
	zip_error_set(&za->error, ZIP_ER_INTERNAL, 0);
	return -1;
    }

    if (zip_source_seek_write(za->src, offend, SEEK_SET) < 0) {
	_zip_error_set_from_source(&za->error, za->src);
	return -1;
    }

    if (de->bitflags & ZIP_GPBF_DATA_DESCRIPTOR) {
	if (write_data_descriptor(za, de, is_zip64) < 0) {
	    return -1;
	}
    }

    return 0;
}